

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
qt_custom_file_engine_handler_create(QString *path)

{
  long lVar1;
  QAbstractFileEngineHandler **ppQVar2;
  QAbstractFileEngineHandler *pQVar3;
  long *plVar4;
  Type *pTVar5;
  pointer *__ptr;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this;
  long lVar6;
  bool bVar7;
  
  if ((__atomic_base<int>)qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i !=
      (__atomic_base<int>)0x0) {
    this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
            *)path;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
    operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                *)path);
    pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             ::operator()(this);
    lVar1 = (pTVar5->super_QList<QAbstractFileEngineHandler_*>).d.size;
    bVar7 = lVar1 == 0;
    if (!bVar7) {
      ppQVar2 = (pTVar5->super_QList<QAbstractFileEngineHandler_*>).d.ptr;
      pQVar3 = *ppQVar2;
      (path->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (*pQVar3->_vptr_QAbstractFileEngineHandler[2])(path);
      if ((path->d).d == (Data *)0x0) {
        lVar6 = 8;
        do {
          (path->d).d = (Data *)0x0;
          bVar7 = lVar1 << 3 == lVar6;
          if (bVar7) goto LAB_00136510;
          plVar4 = *(long **)((long)ppQVar2 + lVar6);
          (path->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          (**(code **)(*plVar4 + 0x10))(path);
          lVar6 = lVar6 + 8;
        } while ((path->d).d == (Data *)0x0);
      }
      if (!bVar7) {
        return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
                )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
                  )path;
      }
    }
  }
LAB_00136510:
  (path->d).d = (Data *)0x0;
  return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
         )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
           )path;
}

Assistant:

std::unique_ptr<QAbstractFileEngine> qt_custom_file_engine_handler_create(const QString &path)
{
    if (qt_file_engine_handlers_in_use.loadRelaxed()) {
        QReadLocker locker(fileEngineHandlerMutex());

        // check for registered handlers that can load the file
        for (QAbstractFileEngineHandler *handler : std::as_const(*fileEngineHandlers())) {
            if (auto engine = handler->create(path))
                return engine;
        }
    }

    return nullptr;
}